

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int scriptsig_to_witness(uchar *bytes,size_t bytes_len,wally_tx_witness_stack **output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  size_t bytes_len_00;
  wally_tx_witness_stack *result;
  size_t push_size;
  size_t push_opcode_size;
  wally_tx_witness_stack *local_50;
  size_t local_48;
  wally_tx_witness_stack **local_40;
  size_t local_38;
  
  local_50 = (wally_tx_witness_stack *)0x0;
  iVar2 = -2;
  if ((((bytes_len != 0) && (bytes != (uchar *)0x0)) && (output != (wally_tx_witness_stack **)0x0))
     && (iVar2 = wally_tx_witness_stack_init_alloc(2,&local_50), iVar2 == 0)) {
    puVar4 = bytes + bytes_len;
    local_40 = output;
    do {
      if (puVar4 <= bytes) {
        *local_40 = local_50;
        return 0;
      }
      bytes_len_00 = (long)puVar4 - (long)bytes;
      iVar3 = get_push_size(bytes,bytes_len_00,false,&local_48);
      if (iVar3 == 0) {
        iVar2 = get_push_size(bytes,bytes_len_00,true,&local_38);
        if (iVar2 == 0) {
          bytes = bytes + local_38;
          iVar3 = wally_tx_witness_stack_add(local_50,bytes,local_48);
          iVar2 = 0;
          if (iVar3 != 0) goto LAB_00406be5;
          bytes = bytes + local_48;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      else {
LAB_00406be5:
        iVar2 = iVar3;
        bVar1 = false;
      }
    } while (bVar1);
    wally_tx_witness_stack_free(local_50);
  }
  return iVar2;
}

Assistant:

static int scriptsig_to_witness(unsigned char *bytes, size_t bytes_len, struct wally_tx_witness_stack **output)
{
    unsigned char *p = bytes, *end = p + bytes_len;
    struct wally_tx_witness_stack *result = NULL;
    int ret = WALLY_OK;

    if (!bytes || !output || !bytes_len) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_tx_witness_stack_init_alloc(2, &result)) != WALLY_OK) {
        return ret;
    }

    while (p < end) {
        size_t push_size, push_opcode_size;

        if ((ret = script_get_push_size_from_bytes(p, end - p, &push_size)) != WALLY_OK) {
            goto fail;
        }
        if ((ret = script_get_push_opcode_size_from_bytes(p, end - p, &push_opcode_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_opcode_size;

        if ((ret = wally_tx_witness_stack_add(result, p, push_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_size;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_tx_witness_stack_free(result);
    return ret;
}